

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_argerror(lua_State *L,int arg,char *extramsg)

{
  int iVar1;
  char *local_b0;
  undefined1 local_a8 [8];
  lua_Debug ar;
  char *extramsg_local;
  int arg_local;
  lua_State *L_local;
  
  ar.i_ci = (CallInfo *)extramsg;
  iVar1 = lua_getstack(L,0,(lua_Debug *)local_a8);
  if (iVar1 == 0) {
    L_local._4_4_ = luaL_error(L,"bad argument #%d (%s)",(ulong)(uint)arg,ar.i_ci);
  }
  else {
    lua_getinfo(L,"n",(lua_Debug *)local_a8);
    iVar1 = strcmp(ar.name,"method");
    extramsg_local._4_4_ = arg;
    if ((iVar1 == 0) && (extramsg_local._4_4_ = arg - 1, extramsg_local._4_4_ == 0)) {
      L_local._4_4_ = luaL_error(L,"calling \'%s\' on bad self (%s)",ar._0_8_,ar.i_ci);
    }
    else {
      if (ar._0_8_ == 0) {
        iVar1 = pushglobalfuncname(L,(lua_Debug *)local_a8);
        if (iVar1 == 0) {
          local_b0 = "?";
        }
        else {
          local_b0 = lua_tolstring(L,-1,(size_t *)0x0);
        }
        ar._0_8_ = local_b0;
      }
      L_local._4_4_ =
           luaL_error(L,"bad argument #%d to \'%s\' (%s)",(ulong)extramsg_local._4_4_,ar._0_8_,
                      ar.i_ci);
    }
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_argerror (lua_State *L, int arg, const char *extramsg) {
  lua_Debug ar;
  if (!lua_getstack(L, 0, &ar))  /* no stack frame? */
    return luaL_error(L, "bad argument #%d (%s)", arg, extramsg);
  lua_getinfo(L, "n", &ar);
  if (strcmp(ar.namewhat, "method") == 0) {
    arg--;  /* do not count 'self' */
    if (arg == 0)  /* error is in the self argument itself? */
      return luaL_error(L, "calling '%s' on bad self (%s)",
                           ar.name, extramsg);
  }
  if (ar.name == NULL)
    ar.name = (pushglobalfuncname(L, &ar)) ? lua_tostring(L, -1) : "?";
  return luaL_error(L, "bad argument #%d to '%s' (%s)",
                        arg, ar.name, extramsg);
}